

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

void __thiscall soinn::ESOINN::mergeClasses(ESOINN *this,int A,int B)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  iVar2 = A;
  if (B < A) {
    iVar2 = B;
  }
  for (p_Var3 = (this->graph).super_type.m_vertices.
                super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&(this->graph).super_type.m_vertices; p_Var3 = p_Var3->_M_next) {
    iVar1 = *(int *)((long)(p_Var3[1]._M_next + 3) + 8);
    if (iVar1 == A || iVar1 == B) {
      *(int *)((long)(p_Var3[1]._M_next + 3) + 8) = iVar2;
    }
  }
  return;
}

Assistant:

void ESOINN::mergeClasses(int A, int B)
{
    int classId = std::min(A, B);
    VertexIterator current, end;
    boost::tie(current, end) = boost::vertices(graph);
    for(; current != end; current++)
    {
        if(graph[*current].classId == A || graph[*current].classId == B)
        {
            graph[*current].classId = classId;
        }
    }
}